

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O2

void __thiscall
OPNMIDIplay::noteUpdate
          (OPNMIDIplay *this,size_t midCh,notes_iterator i,uint props_mask,int32_t select_adlchn)

{
  uint32_t *puVar1;
  double dVar2;
  double dVar3;
  byte bVar4;
  ushort uVar5;
  short sVar6;
  uint uVar7;
  OPN2 *this_00;
  size_t sVar8;
  OpnInstMeta *pOVar9;
  pointer pMVar10;
  NoteHook p_Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  users_iterator uVar17;
  int iVar18;
  byte bVar19;
  OpnTimbre *instrument;
  byte bVar20;
  OpnChannel *this_01;
  uint16_t *ph;
  uint ccount;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  Location my_loc;
  
  this_00 = (this->m_synth).m_p;
  iVar16 = (int)((i.cell_)->value).noteTone;
  dVar2 = ((i.cell_)->value).currentTone;
  bVar4 = ((i.cell_)->value).vol;
  sVar8 = ((i.cell_)->value).midiins;
  pOVar9 = ((i.cell_)->value).ains;
  my_loc.MidCh = (uint16_t)midCh;
  my_loc.note = ((i.cell_)->value).note;
  if (((i.cell_)->value).isBlank == true) {
    if ((props_mask & 0x20) != 0) {
      pl_list<OPNMIDIplay::MIDIchannel::NoteInfo>::erase
                (&(this->m_midiChannels).
                  super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                  ._M_impl.super__Vector_impl_data._M_start[midCh].activenotes,(iterator)i.cell_);
      return;
    }
  }
  else {
    uVar22 = (ulong)((i.cell_)->value).chip_channels_count;
    instrument = &((i.cell_)->value).chip_channels[0].ains;
    while (bVar23 = uVar22 != 0, uVar22 = uVar22 - 1, bVar23) {
      uVar5 = instrument[-1].noteOffset;
      if (((props_mask & 1) != 0) && (select_adlchn < 0 || (uint)uVar5 == select_adlchn)) {
        OPN2::setPatch(this_00,(ulong)uVar5,instrument);
        uVar17 = OpnChannel::find_or_create_user
                           ((this->m_chipChannels).
                            super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar5,&my_loc);
        if (((uVar17.cell_)->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next !=
            (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0) {
          ((uVar17.cell_)->value).sustained = 0;
          ((uVar17.cell_)->value).vibdelay_us = 0;
          uVar5 = pOVar9->soundKeyOnMs;
          ((uVar17.cell_)->value).fixed_sustain = (ulong)uVar5 == 40000;
          ((uVar17.cell_)->value).kon_time_until_neglible_us = (ulong)uVar5 * 1000;
          uVar12 = *(undefined8 *)&instrument[-1].noteOffset;
          uVar13 = *(undefined8 *)(instrument->OPS[0].data + 6);
          uVar14 = *(undefined8 *)(instrument->OPS + 2);
          uVar15 = *(undefined8 *)(instrument->OPS[3].data + 1);
          ((uVar17.cell_)->value).ins.chip_chan = (short)uVar12;
          ((uVar17.cell_)->value).ins.ains.OPS[0].data[0] = (char)((ulong)uVar12 >> 0x10);
          ((uVar17.cell_)->value).ins.ains.OPS[0].data[1] = (char)((ulong)uVar12 >> 0x18);
          ((uVar17.cell_)->value).ins.ains.OPS[0].data[2] = (char)((ulong)uVar12 >> 0x20);
          ((uVar17.cell_)->value).ins.ains.OPS[0].data[3] = (char)((ulong)uVar12 >> 0x28);
          ((uVar17.cell_)->value).ins.ains.OPS[0].data[4] = (char)((ulong)uVar12 >> 0x30);
          ((uVar17.cell_)->value).ins.ains.OPS[0].data[5] = (char)((ulong)uVar12 >> 0x38);
          *(undefined8 *)(((uVar17.cell_)->value).ins.ains.OPS[0].data + 6) = uVar13;
          *(undefined8 *)(((uVar17.cell_)->value).ins.ains.OPS + 2) = uVar14;
          *(undefined8 *)(((uVar17.cell_)->value).ins.ains.OPS[3].data + 1) = uVar15;
          ((uVar17.cell_)->value).ins.ains.noteOffset = instrument->noteOffset;
        }
      }
      instrument = (OpnTimbre *)(instrument[1].OPS[0].data + 2);
    }
    for (uVar21 = 0; uVar7 = ((i.cell_)->value).chip_channels_count, uVar21 < uVar7;
        uVar21 = uVar21 + 1) {
      uVar5 = ((i.cell_)->value).chip_channels[uVar21].chip_chan;
      uVar22 = (ulong)uVar5;
      if ((select_adlchn < 0) || ((uint)uVar5 == select_adlchn)) {
        ph = &((i.cell_)->value).chip_channels[uVar21].chip_chan;
        iVar18 = (int)sVar8;
        if ((props_mask & 0x20) == 0) {
          if ((props_mask & 2) != 0) {
            OPN2::setPan(this_00,uVar22,
                         (this->m_midiChannels).
                         super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                         ._M_impl.super__Vector_impl_data._M_start[midCh].panning);
          }
          if ((props_mask & 4) != 0) {
            pMVar10 = (this->m_midiChannels).
                      super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            bVar19 = pMVar10[midCh].brightness;
            if ((pMVar10[midCh].is_xg_percussion & 1U) != 0) {
              bVar19 = 0x7f;
            }
            if (midCh == 9) {
              bVar19 = 0x7f;
            }
            bVar20 = bVar19 * '\x02';
            if (0x3f < bVar19) {
              bVar20 = 0x7f;
            }
            if ((this->m_setup).fullRangeBrightnessCC74 != false) {
              bVar20 = bVar19;
            }
            OPN2::touchNote(this_00,uVar22,(ulong)bVar4,(ulong)pMVar10[midCh].volume,
                            (ulong)pMVar10[midCh].expression,bVar20);
          }
          if (((props_mask & 8) != 0) &&
             ((uVar17 = OpnChannel::find_user
                                  ((this->m_chipChannels).
                                   super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar22,&my_loc),
              ((uVar17.cell_)->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next ==
              (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0 ||
              (((uVar17.cell_)->value).sustained == 0)))) {
            pMVar10 = (this->m_midiChannels).
                      super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            dVar24 = (double)pMVar10[midCh].bend * pMVar10[midCh].bendsense;
            bVar19 = pMVar10[midCh].aftertouch;
            if (pMVar10[midCh].aftertouch < pMVar10[midCh].vibrato) {
              bVar19 = pMVar10[midCh].vibrato;
            }
            bVar20 = ((i.cell_)->value).vibrato;
            if (bVar19 <= bVar20) {
              bVar19 = bVar20;
            }
            sVar6 = ph[0x10];
            dVar25 = 0.0;
            if ((pOVar9->flags & 1) != 0) {
              bVar23 = operator==((OpnTimbre *)(ph + 1),pOVar9->op + 1);
              dVar25 = 0.0;
              if (bVar23) {
                dVar25 = pOVar9->voice2_fine_tune;
              }
            }
            dVar27 = (double)(int)sVar6 + dVar24;
            if ((bVar19 != 0) &&
               ((((uVar17.cell_)->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next
                 == (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0 ||
                (pMVar10[midCh].vibdelay_us <= ((uVar17.cell_)->value).vibdelay_us)))) {
              dVar3 = pMVar10[midCh].vibdepth;
              dVar26 = sin(pMVar10[midCh].vibpos);
              dVar27 = dVar27 + dVar26 * (double)bVar19 * dVar3;
            }
            OPN2::noteOn(this_00,uVar22,dVar25 + dVar27 + dVar2);
            p_Var11 = (this->hooks).onNote;
            if (p_Var11 != (NoteHook)0x0) {
              (*p_Var11)((this->hooks).onNote_userData,(uint)uVar5,iVar16,iVar18,(uint)bVar4,dVar24)
              ;
            }
          }
        }
        else {
          this_01 = (this->m_chipChannels).
                    super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar22;
          if ((this->m_midiChannels).
              super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
              ._M_impl.super__Vector_impl_data._M_start[midCh].sustain == false) {
            uVar17 = OpnChannel::find_user(this_01,&my_loc);
            if ((((uVar17.cell_)->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next
                 == (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0) ||
               ((((uVar17.cell_)->value).sustained & 2) != 0)) {
              bVar23 = false;
            }
            else {
              pl_list<OPNMIDIplay::OpnChannel::LocationData>::erase
                        (&(this->m_chipChannels).
                          super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar22].users,
                         (iterator)uVar17.cell_);
              bVar23 = true;
            }
            p_Var11 = (this->hooks).onNote;
            if (p_Var11 != (NoteHook)0x0) {
              (*p_Var11)((this->hooks).onNote_userData,(uint)uVar5,iVar16,iVar18,0,0.0);
            }
            if ((bVar23) &&
               ((this->m_chipChannels).
                super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar22].users.size_ == 0)) {
              OPN2::noteOff(this_00,uVar22);
              if ((props_mask & 0x40) == 0) {
                (this->m_chipChannels).
                super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar22].koff_time_until_neglible_us =
                     (ulong)pOVar9->soundKeyOffMs * 1000;
              }
              else {
                OPN2::touchNote(this_00,uVar22,0,0x7f,0x7f,'\x7f');
                (this->m_chipChannels).
                super__Vector_base<OPNMIDIplay::OpnChannel,_std::allocator<OPNMIDIplay::OpnChannel>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar22].koff_time_until_neglible_us = 0;
              }
            }
          }
          else {
            uVar17 = OpnChannel::find_or_create_user(this_01,&my_loc);
            if (((uVar17.cell_)->super_pl_basic_cell<OPNMIDIplay::OpnChannel::LocationData>).next !=
                (pl_cell<OPNMIDIplay::OpnChannel::LocationData> *)0x0) {
              puVar1 = &((uVar17.cell_)->value).sustained;
              *(byte *)puVar1 = (byte)*puVar1 | 1;
            }
            p_Var11 = (this->hooks).onNote;
            if (p_Var11 != (NoteHook)0x0) {
              (*p_Var11)((this->hooks).onNote_userData,(uint)uVar5,iVar16,iVar18,-1,0.0);
            }
          }
          MIDIchannel::NoteInfo::phys_erase_at(&(i.cell_)->value,(Phys *)ph);
          uVar21 = uVar21 - 1;
        }
      }
    }
    if (uVar7 == 0) {
      MIDIchannel::cleanupNote
                ((this->m_midiChannels).
                 super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                 ._M_impl.super__Vector_impl_data._M_start + midCh,i);
      pl_list<OPNMIDIplay::MIDIchannel::NoteInfo>::erase
                (&(this->m_midiChannels).
                  super__Vector_base<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>
                  ._M_impl.super__Vector_impl_data._M_start[midCh].activenotes,(iterator)i.cell_);
    }
  }
  return;
}

Assistant:

void OPNMIDIplay::noteUpdate(size_t midCh,
                          OPNMIDIplay::MIDIchannel::notes_iterator i,
                          unsigned props_mask,
                          int32_t select_adlchn)
{
    Synth &synth = *m_synth;
    MIDIchannel::NoteInfo &info = i->value;
    const int16_t noteTone    = info.noteTone;
    const double currentTone    = info.currentTone;
    const uint8_t vol     = info.vol;
    const size_t midiins = info.midiins;
    const OpnInstMeta &ains = *info.ains;
    OpnChannel::Location my_loc;
    my_loc.MidCh = static_cast<uint16_t>(midCh);
    my_loc.note  = info.note;

    if(info.isBlank)
    {
        if(props_mask & Upd_Off)
            m_midiChannels[midCh].activenotes.erase(i);
        return;
    }

    for(unsigned ccount = 0, ctotal = info.chip_channels_count; ccount < ctotal; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c   = ins.chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn) continue;

        if(props_mask & Upd_Patch)
        {
            synth.setPatch(c, ins.ains);
            OpnChannel::users_iterator ci = m_chipChannels[c].find_or_create_user(my_loc);
            if(!ci.is_end())    // inserts if necessary
            {
                OpnChannel::LocationData &d = ci->value;
                d.sustained = OpnChannel::LocationData::Sustain_None;
                d.vibdelay_us  = 0;
                d.fixed_sustain = (ains.soundKeyOnMs == static_cast<uint16_t>(opnNoteOnMaxTime));
                d.kon_time_until_neglible_us = 1000 * ains.soundKeyOnMs;
                d.ins       = ins;
            }
        }
    }

    for(unsigned ccount = 0; ccount < info.chip_channels_count; ccount++)
    {
        const MIDIchannel::NoteInfo::Phys &ins = info.chip_channels[ccount];
        uint16_t c   = ins.chip_chan;

        if(select_adlchn >= 0 && c != select_adlchn)
            continue;

        if(props_mask & Upd_Off) // note off
        {
            if(m_midiChannels[midCh].sustain == 0)
            {
                OpnChannel::users_iterator k = m_chipChannels[c].find_user(my_loc);
                bool do_erase_user = (!k.is_end() && ((k->value.sustained & OpnChannel::LocationData::Sustain_Sostenuto) == 0));
                if(do_erase_user)
                    m_chipChannels[c].users.erase(k);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, static_cast<int>(midiins), 0, 0.0);

                if(do_erase_user && m_chipChannels[c].users.empty())
                {
                    synth.noteOff(c);
                    if(props_mask & Upd_Mute) // Mute the note
                    {
                        synth.touchNote(c, 0);
                        m_chipChannels[c].koff_time_until_neglible_us = 0;
                    }
                    else
                    {
                        m_chipChannels[c].koff_time_until_neglible_us = 1000 * int64_t(ains.soundKeyOffMs);
                    }
                }
            }
            else
            {
                // Sustain: Forget about the note, but don't key it off.
                //          Also will avoid overwriting it very soon.
                OpnChannel::users_iterator d = m_chipChannels[c].find_or_create_user(my_loc);
                if(!d.is_end())
                    d->value.sustained |= OpnChannel::LocationData::Sustain_Pedal; // note: not erased!
                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, static_cast<int>(midiins), -1, 0.0);
            }

            info.phys_erase_at(&ins);  // decrements channel count
            --ccount;  // adjusts index accordingly
            continue;
        }

        if(props_mask & Upd_Pan)
            synth.setPan(c, m_midiChannels[midCh].panning);

        if(props_mask & Upd_Volume)
        {
            const MIDIchannel &ch = m_midiChannels[midCh];
            bool is_percussion = (midCh == 9) || ch.is_xg_percussion;
            uint_fast32_t brightness = is_percussion ? 127 : ch.brightness;

            if(!m_setup.fullRangeBrightnessCC74)
            {
                // Simulate post-High-Pass filter result which affects sounding by half level only
                if(brightness >= 64)
                    brightness = 127;
                else
                    brightness *= 2;
            }

            synth.touchNote(c,
                            vol,
                            ch.volume,
                            ch.expression,
                            static_cast<uint8_t>(brightness));
        }

        if(props_mask & Upd_Pitch)
        {
            OpnChannel::users_iterator d = m_chipChannels[c].find_user(my_loc);

            // Don't bend a sustained note
            if(d.is_end() || (d->value.sustained == OpnChannel::LocationData::Sustain_None))
            {
                MIDIchannel &chan = m_midiChannels[midCh];
                double midibend = chan.bend * chan.bendsense;
                double bend = midibend + ins.ains.noteOffset;
                double phase = 0.0;
                uint8_t vibrato = std::max(chan.vibrato, chan.aftertouch);

                vibrato = std::max(vibrato, info.vibrato);

                if((ains.flags & OpnInstMeta::Flag_Pseudo8op) && ins.ains == ains.op[1])
                {
                    phase = ains.voice2_fine_tune;
                }

                if(vibrato && (d.is_end() || d->value.vibdelay_us >= chan.vibdelay_us))
                    bend += static_cast<double>(vibrato) * chan.vibdepth * std::sin(chan.vibpos);

                synth.noteOn(c, currentTone + bend + phase);

                if(hooks.onNote)
                    hooks.onNote(hooks.onNote_userData, c, noteTone, static_cast<int>(midiins), vol, midibend);
            }
        }
    }

    if(info.chip_channels_count == 0)
    {
        m_midiChannels[midCh].cleanupNote(i);
        m_midiChannels[midCh].activenotes.erase(i);
    }
}